

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void EMIT_OP_REG(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1)

{
  x86Instruction *pxVar1;
  
  if (0x49 < (int)op) {
    switch(op) {
    case o_read_register:
      goto switchD_001c8bdc_caseD_4a;
    case o_kill_register:
      if (ctx->genRegRead[reg1] == false) {
        if (ctx->x86Base[ctx->genRegUpdate[reg1]].name != o_none) {
          ctx->x86Base[ctx->genRegUpdate[reg1]].name = o_none;
          ctx->optimizationCount = ctx->optimizationCount + 1;
        }
      }
      ctx->genReg[reg1].type = argNone;
      goto LAB_001c8c20;
    default:
      goto switchD_001c8ba3_caseD_1b;
    case o_neg64:
    case o_not64:
      goto switchD_001c8ba3_caseD_1c;
    case o_imul64:
      goto switchD_001c8ba3_caseD_21;
    case o_idiv64:
      goto switchD_001c8ba3_caseD_22;
    case o_sal64:
    case o_sar64:
      goto switchD_001c8ba3_caseD_24;
    }
  }
  switch(op) {
  case o_call:
    ctx->genRegRead[reg1] = true;
    CodeGenGenericContext::KillUnreadRegisters(ctx);
    CodeGenGenericContext::InvalidateState(ctx);
    break;
  case o_ret:
  case o_add:
  case o_adc:
  case o_sub:
  case o_sbb:
  case o_shl:
  case o_and:
  case o_or:
  case o_xor:
  case o_cmp:
  case o_test:
switchD_001c8ba3_caseD_1b:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x3cb,"void EMIT_OP_REG(CodeGenGenericContext &, x86Command, x86Reg)");
  case o_imul:
switchD_001c8ba3_caseD_21:
    ctx->genRegRead[reg1] = true;
    CodeGenGenericContext::InvalidateDependand(ctx,rEAX);
    ctx->genReg[1].type = argNone;
    ctx->genRegUpdate[1] = (int)((ulong)((long)ctx->x86Op - (long)ctx->x86Base) >> 4) * -0x33333333;
    ctx->genRegRead[1] = false;
    CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,rEDX);
    break;
  case o_idiv:
switchD_001c8ba3_caseD_22:
    ctx->genRegRead[reg1] = true;
    CodeGenGenericContext::InvalidateDependand(ctx,rEAX);
    ctx->genReg[1].type = argNone;
    ctx->genRegUpdate[1] = (int)((ulong)((long)ctx->x86Op - (long)ctx->x86Base) >> 4) * -0x33333333;
    ctx->genRegRead[1] = false;
    CodeGenGenericContext::InvalidateDependand(ctx,rEDX);
    ctx->genReg[4].type = argNone;
    ctx->genRegUpdate[4] = (int)((ulong)((long)ctx->x86Op - (long)ctx->x86Base) >> 4) * -0x33333333;
    ctx->genRegRead[1] = true;
    ctx->genRegRead[4] = true;
    break;
  case o_sal:
  case o_sar:
switchD_001c8ba3_caseD_24:
    ctx->genRegRead[3] = true;
  case o_neg:
  case o_not:
  case o_setl:
  case o_setg:
  case o_setle:
  case o_setge:
  case o_sete:
  case o_setne:
  case o_setz:
  case o_setnz:
switchD_001c8ba3_caseD_1c:
    CodeGenGenericContext::InvalidateDependand(ctx,reg1);
    ctx->genReg[reg1].type = argNone;
    ctx->genRegUpdate[reg1] =
         (int)((ulong)((long)ctx->x86Op - (long)ctx->x86Base) >> 4) * -0x33333333;
    ctx->genRegRead[reg1] = false;
    break;
  default:
    if (op == o_push) {
      if (ctx->skipTracking != false) break;
    }
    else {
      if (op != o_pop) goto switchD_001c8ba3_caseD_1b;
      if (ctx->skipTracking != false) break;
      CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
    }
switchD_001c8bdc_caseD_4a:
    ctx->genRegRead[reg1] = true;
  }
LAB_001c8c20:
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argReg;
  (pxVar1->argA).field_1.reg = reg1;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).type = argNone;
  ctx->x86Op = pxVar1 + 1;
  return;
}

Assistant:

void EMIT_OP_REG(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_call:
		ctx.ReadRegister(reg1);

		ctx.KillUnreadRegisters();

		ctx.InvalidateState();
		break;
	case o_setl:
	case o_setg:
	case o_setle:
	case o_setge:
	case o_sete:
	case o_setne:
	case o_setz:
	case o_setnz:
		ctx.ReadAndModifyRegister(reg1); // Since instruction sets only lower bits, it 'reads' the rest
		break;
	case o_imul:
	case o_imul64:
		// TODO: check if direct operation with memory is possible

		ctx.ReadRegister(reg1);

		ctx.ReadAndModifyRegister(rEAX);
		ctx.OverwriteRegisterWithUnknown(rEDX); // Don't care about top bits here
		break;
	case o_idiv:
	case o_idiv64:
		// TODO: check if direct operation with memory is possible

		ctx.ReadRegister(reg1);

		ctx.ReadAndModifyRegister(rEAX);
		ctx.ReadAndModifyRegister(rEDX);

		// Implicitly read the result so when one of the registers is killed, it will not remove the instruction (there's room for improvement)
		ctx.ReadRegister(rEAX);
		ctx.ReadRegister(rEDX);
		break;
	case o_neg:
	case o_not:
	case o_neg64:
	case o_not64:
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_push:
		if(ctx.skipTracking)
			break;

		ctx.ReadRegister(reg1);
		break;
	case o_pop:
		if(ctx.skipTracking)
			break;

		ctx.OverwriteRegisterWithUnknown(reg1);

		// Push and pop are part of the frame setup, so implicitly use the register so it won't be removed
		ctx.ReadRegister(reg1);
		break;
	case o_sal:
	case o_sar:
	case o_sal64:
	case o_sar64:
		ctx.ReadRegister(rECX);

		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_read_register:
		ctx.ReadRegister(reg1);
		break;
	case o_kill_register:
		ctx.KillRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#else
	if(op == o_call)
		ctx.InvalidateState();
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argNone;
	ctx.x86Op++;
}